

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTextEdit::ExtraSelection>::relocate
          (QArrayDataPointer<QTextEdit::ExtraSelection> *this,qsizetype offset,ExtraSelection **data
          )

{
  bool bVar1;
  long n;
  ExtraSelection *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTextEdit::ExtraSelection> *in_RDI;
  ExtraSelection **unaff_retaddr;
  ExtraSelection *res;
  QArrayDataPointer<QTextEdit::ExtraSelection> *c;
  
  n = *(long *)&in_RDI->ptr + in_RSI * 0x18;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QTextEdit::ExtraSelection,long_long>
            (in_RDX,n,(ExtraSelection *)in_RDI);
  if ((in_RDX != (ExtraSelection *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QTextEdit::ExtraSelection>,QTextEdit::ExtraSelection_const*>
                        (unaff_retaddr,c), bVar1)) {
    *(long *)in_RDX = in_RSI * 0x18 + *(long *)in_RDX;
  }
  *(long *)&in_RDI->ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }